

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testdemon.cpp
# Opt level: O3

void my_slot_demon(Am_Slot slot)

{
  uint uVar1;
  Am_Value *pAVar2;
  long *plVar3;
  Am_Object_Advanced self;
  Am_Object aAStack_18 [2];
  
  Am_Slot::Get_Owner();
  pAVar2 = (Am_Value *)Am_Object::Get((ushort)aAStack_18,0x65);
  uVar1 = Am_Value::operator_cast_to_int(pAVar2);
  Am_Object::Set((ushort)aAStack_18,(uint)MY_SLOT,(ulong)uVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"demon activated at ",0x13);
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cerr,uVar1);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Network contains ",0x11)
  ;
  pAVar2 = (Am_Value *)Am_Object::Get(0x5240,(ulong)MY_SLOT);
  plVar3 = (long *)operator<<((ostream *)&std::cerr,pAVar2);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  std::ostream::flush();
  Am_Object::~Am_Object(aAStack_18);
  return;
}

Assistant:

void
my_slot_demon(Am_Slot slot)

{

  Am_Object_Advanced self = slot.Get_Owner();
  int top;
  top = self.Get(Am_TOP);
  self.Set(MY_SLOT, top);

  cerr << "demon activated at " << top << endl << flush;
  cerr << "Network contains " << Foo.Peek(MY_SLOT) << endl << flush;
}